

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncQueue.h
# Opt level: O0

void __thiscall
nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
          (AsyncQueue<nrg::TimedExecution> *this,duration<long,_std::ratio<1L,_1000L>_> *param,
          TimedCaller *param_2)

{
  TimedCaller local_50;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  TimedCaller *param_local_1;
  duration<long,_std::ratio<1L,_1000L>_> *param_local;
  AsyncQueue<nrg::TimedExecution> *this_local;
  
  lock._M_device = (mutex_type *)param_2;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->guard_);
  TimedCaller::TimedCaller(&local_50,(TimedCaller *)lock._M_device);
  TimedExecution::push<long,std::ratio<1l,1000l>,TimedCaller>(&this->queue_,param,&local_50);
  TimedCaller::~TimedCaller(&local_50);
  std::condition_variable::notify_one();
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return;
}

Assistant:

void operator()(Param&&... param)
    {
        std::lock_guard<std::mutex> lock(guard_);
        AsyncStyle::push(queue_, std::forward<Param>(param)...);
        cond_.notify_one();
    }